

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::next_word(Fl_Text_Display *this)

{
  int iVar1;
  uint uVar2;
  Fl_Text_Buffer *pFVar3;
  bool bVar4;
  undefined4 local_14;
  int pos;
  Fl_Text_Display *this_local;
  
  local_14 = insert_position(this);
  while( true ) {
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar3);
    bVar4 = false;
    if (local_14 < iVar1) {
      pFVar3 = buffer(this);
      uVar2 = Fl_Text_Buffer::char_at(pFVar3,local_14);
      iVar1 = fl_isseparator(uVar2);
      bVar4 = iVar1 == 0;
    }
    if (!bVar4) break;
    pFVar3 = buffer(this);
    local_14 = Fl_Text_Buffer::next_char(pFVar3,local_14);
  }
  while( true ) {
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar3);
    bVar4 = false;
    if (local_14 < iVar1) {
      pFVar3 = buffer(this);
      uVar2 = Fl_Text_Buffer::char_at(pFVar3,local_14);
      iVar1 = fl_isseparator(uVar2);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    pFVar3 = buffer(this);
    local_14 = Fl_Text_Buffer::next_char(pFVar3,local_14);
  }
  insert_position(this,local_14);
  return;
}

Assistant:

void Fl_Text_Display::next_word() {
  int pos = insert_position();

  while (pos < buffer()->length() && !fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  while (pos < buffer()->length() && fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  insert_position( pos );
}